

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O0

mod2sparse * mod2sparse_allocate(int n_rows,int n_cols)

{
  mod2sparse *pmVar1;
  mod2entry *pmVar2;
  int in_ESI;
  int in_EDI;
  int j;
  int i;
  mod2entry *e;
  mod2sparse *m;
  uint in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  int iVar3;
  
  if ((0 < in_EDI) && (0 < in_ESI)) {
    pmVar1 = (mod2sparse *)chk_alloc(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    pmVar1->n_rows = in_EDI;
    pmVar1->n_cols = in_ESI;
    pmVar2 = (mod2entry *)chk_alloc(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    pmVar1->rows = pmVar2;
    pmVar2 = (mod2entry *)chk_alloc(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    pmVar1->cols = pmVar2;
    pmVar1->blocks = (mod2block *)0x0;
    pmVar1->next_free = (mod2entry *)0x0;
    for (iVar3 = 0; iVar3 < in_EDI; iVar3 = iVar3 + 1) {
      pmVar2 = pmVar1->rows + iVar3;
      pmVar2->down = pmVar2;
      pmVar2->up = pmVar2;
      pmVar2->right = pmVar2;
      pmVar2->left = pmVar2;
      pmVar2->col = -1;
      pmVar2->row = -1;
    }
    for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
      pmVar2 = pmVar1->cols + iVar3;
      pmVar2->down = pmVar2;
      pmVar2->up = pmVar2;
      pmVar2->right = pmVar2;
      pmVar2->left = pmVar2;
      pmVar2->col = -1;
      pmVar2->row = -1;
    }
    return pmVar1;
  }
  fprintf(_stderr,"mod2sparse_allocate: Invalid number of rows or columns\n");
  exit(1);
}

Assistant:

mod2sparse *mod2sparse_allocate
( int n_rows, 		/* Number of rows in matrix */
  int n_cols		/* Number of columns in matrix */
)
{
  mod2sparse *m;
  mod2entry *e;
  int i, j;

  if (n_rows<=0 || n_cols<=0)
  { fprintf(stderr,"mod2sparse_allocate: Invalid number of rows or columns\n");
    exit(1);
  }

  m = chk_alloc (1, sizeof *m);

  m->n_rows = n_rows;
  m->n_cols = n_cols;

  m->rows = chk_alloc (n_rows, sizeof *m->rows);
  m->cols = chk_alloc (n_cols, sizeof *m->cols);

  m->blocks = 0;
  m->next_free = 0;

  for (i = 0; i<n_rows; i++)
  { e = &m->rows[i];
    e->left = e->right = e->up = e->down = e;
    e->row = e->col = -1;
  }

  for (j = 0; j<n_cols; j++)
  { e = &m->cols[j];
    e->left = e->right = e->up = e->down = e;
    e->row = e->col = -1;
  }

  return m;
}